

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

int ZSTD_shouldAttachDict(ZSTD_CDict *cdict,ZSTD_CCtx_params *params,U64 pledgedSrcSize)

{
  byte local_26;
  byte local_25;
  int dedicatedDictSearch;
  size_t cutoff;
  U64 pledgedSrcSize_local;
  ZSTD_CCtx_params *params_local;
  ZSTD_CDict *cdict_local;
  
  local_25 = 1;
  if ((cdict->matchState).dedicatedDictSearch == 0) {
    if ((((pledgedSrcSize <= attachDictSizeCutoffs[(cdict->matchState).cParams.strategy]) ||
         (pledgedSrcSize == 0xffffffffffffffff)) ||
        (local_26 = 0, params->attachDictPref == ZSTD_dictForceAttach)) &&
       (local_26 = 0, params->attachDictPref != ZSTD_dictForceCopy)) {
      local_26 = params->forceWindow != 0 ^ 0xff;
    }
    local_25 = local_26;
  }
  return (int)(local_25 & 1);
}

Assistant:

static int ZSTD_shouldAttachDict(const ZSTD_CDict* cdict,
                                 const ZSTD_CCtx_params* params,
                                 U64 pledgedSrcSize)
{
    size_t cutoff = attachDictSizeCutoffs[cdict->matchState.cParams.strategy];
    int const dedicatedDictSearch = cdict->matchState.dedicatedDictSearch;
    return dedicatedDictSearch
        || ( ( pledgedSrcSize <= cutoff
            || pledgedSrcSize == ZSTD_CONTENTSIZE_UNKNOWN
            || params->attachDictPref == ZSTD_dictForceAttach )
          && params->attachDictPref != ZSTD_dictForceCopy
          && !params->forceWindow ); /* dictMatchState isn't correctly
                                      * handled in _enforceMaxDist */
}